

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O0

void deqp::gles2::Accuracy::getAffineTexCoord2D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  float fVar1;
  bool bVar2;
  reference pvVar3;
  float *pfVar4;
  float local_ac;
  Vector<float,_2> local_a4;
  Vector<float,_2> local_9c;
  Vec2 p3;
  Vector<float,_2> local_8c;
  Vec2 p2;
  Vector<float,_2> local_7c;
  Vec2 p1;
  Vector<float,_2> local_6c;
  Vec2 p0;
  Mat2 transform;
  undefined1 local_4c [8];
  Mat2 shearMatrix;
  undefined1 local_28 [4];
  float shearX;
  Mat2 rotMatrix;
  float angle;
  int cellNdx_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  rotMatrix.m_data.m_data[1].m_data[1] = (float)cellNdx;
  getBasicTexCoord2D(dst,cellNdx);
  rotMatrix.m_data.m_data[1].m_data[0] =
       (float)(int)rotMatrix.m_data.m_data[1].m_data[1] * 0.0625 * 6.2831855;
  tcu::rotationMatrix((tcu *)local_28,rotMatrix.m_data.m_data[1].m_data[0]);
  bVar2 = de::inRange<int>((int)rotMatrix.m_data.m_data[1].m_data[1],4,0xb);
  if (bVar2) {
    local_ac = (float)(0xf - (int)rotMatrix.m_data.m_data[1].m_data[1]) / 16.0;
  }
  else {
    local_ac = 0.0;
  }
  tcu::Vector<float,_2>::Vector(transform.m_data.m_data + 1,local_ac,0.0);
  tcu::shearMatrix((tcu *)local_4c,transform.m_data.m_data + 1);
  tcu::operator*((tcu *)&p0,(Matrix<float,_2,_2> *)local_28,(Matrix<float,_2,_2> *)local_4c);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  tcu::Vector<float,_2>::Vector(&p1,fVar1,*pvVar3);
  tcu::operator*((tcu *)&local_6c,(Matrix<float,_2,_2> *)&p0,&p1);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  tcu::Vector<float,_2>::Vector(&p2,fVar1,*pvVar3);
  tcu::operator*((tcu *)&local_7c,(Matrix<float,_2,_2> *)&p0,&p2);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,4);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,5);
  tcu::Vector<float,_2>::Vector(&p3,fVar1,*pvVar3);
  tcu::operator*((tcu *)&local_8c,(Matrix<float,_2,_2> *)&p0,&p3);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,6);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
  tcu::Vector<float,_2>::Vector(&local_a4,fVar1,*pvVar3);
  tcu::operator*((tcu *)&local_9c,(Matrix<float,_2,_2> *)&p0,&local_a4);
  pfVar4 = tcu::Vector<float,_2>::x(&local_6c);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_2>::y(&local_6c);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_2>::x(&local_7c);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_2>::y(&local_7c);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_2>::x(&local_8c);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,4);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_2>::y(&local_8c);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,5);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_2>::x(&local_9c);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,6);
  *pvVar3 = fVar1;
  pfVar4 = tcu::Vector<float,_2>::y(&local_9c);
  fVar1 = *pfVar4;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
  *pvVar3 = fVar1;
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)&p0);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_4c);
  tcu::Matrix<float,_2,_2>::~Matrix((Matrix<float,_2,_2> *)local_28);
  return;
}

Assistant:

static void getAffineTexCoord2D (std::vector<float>& dst, int cellNdx)
{
	// Use basic coords as base.
	getBasicTexCoord2D(dst, cellNdx);

	// Rotate based on cell index.
	float		angle		= 2.0f*DE_PI * ((float)cellNdx / 16.0f);
	tcu::Mat2	rotMatrix	= tcu::rotationMatrix(angle);

	// Second and third row are sheared.
	float		shearX		= de::inRange(cellNdx, 4, 11) ? (float)(15-cellNdx) / 16.0f : 0.0f;
	tcu::Mat2	shearMatrix	= tcu::shearMatrix(tcu::Vec2(shearX, 0.0f));

	tcu::Mat2	transform	= rotMatrix * shearMatrix;
	Vec2		p0			= transform * Vec2(dst[0], dst[1]);
	Vec2		p1			= transform * Vec2(dst[2], dst[3]);
	Vec2		p2			= transform * Vec2(dst[4], dst[5]);
	Vec2		p3			= transform * Vec2(dst[6], dst[7]);

	dst[0] = p0.x();	dst[1] = p0.y();
	dst[2] = p1.x();	dst[3] = p1.y();
	dst[4] = p2.x();	dst[5] = p2.y();
	dst[6] = p3.x();	dst[7] = p3.y();
}